

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptAssignmentExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  EHlslTokenClass op;
  TIntermTyped *pTVar2;
  TIntermTyped *local_48;
  TIntermTyped *rightNode;
  TSourceLoc loc;
  TOperator assignOp;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    bVar1 = acceptInitializer(this,node);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      expected(this,"initializer");
      this_local._7_1_ = false;
    }
  }
  else {
    bVar1 = acceptConditionalExpression(this,node);
    if (bVar1) {
      op = HlslTokenStream::peek(&this->super_HlslTokenStream);
      loc._20_4_ = HlslOpMap::assignment(op);
      if (loc._20_4_ == EOpNull) {
        this_local._7_1_ = true;
      }
      else {
        rightNode = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
        loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
        loc.string = (this->super_HlslTokenStream).token.loc.column;
        loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        local_48 = (TIntermTyped *)0x0;
        bVar1 = acceptAssignmentExpression(this,&local_48);
        if (bVar1) {
          pTVar2 = HlslParseContext::handleAssign
                             (this->parseContext,(TSourceLoc *)&rightNode,loc._20_4_,*node,local_48)
          ;
          *node = pTVar2;
          pTVar2 = HlslParseContext::handleLvalue
                             (this->parseContext,(TSourceLoc *)&rightNode,"assign",node);
          *node = pTVar2;
          if (*node == (TIntermTyped *)0x0) {
            (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0x2d])
                      (this->parseContext,&rightNode,"could not create assignment","");
            this_local._7_1_ = false;
          }
          else {
            bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = true;
            }
          }
        }
        else {
          expected(this,"assignment expression");
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptAssignmentExpression(TIntermTyped*& node)
{
    // initializer
    if (peekTokenClass(EHTokLeftBrace)) {
        if (acceptInitializer(node))
            return true;

        expected("initializer");
        return false;
    }

    // conditional_expression
    if (! acceptConditionalExpression(node))
        return false;

    // assignment operation?
    TOperator assignOp = HlslOpMap::assignment(peek());
    if (assignOp == EOpNull)
        return true;

    // assign_op
    TSourceLoc loc = token.loc;
    advanceToken();

    // conditional_expression assign_op conditional_expression ...
    // Done by recursing this function, which automatically
    // gets the right-to-left associativity.
    TIntermTyped* rightNode = nullptr;
    if (! acceptAssignmentExpression(rightNode)) {
        expected("assignment expression");
        return false;
    }

    node = parseContext.handleAssign(loc, assignOp, node, rightNode);
    node = parseContext.handleLvalue(loc, "assign", node);

    if (node == nullptr) {
        parseContext.error(loc, "could not create assignment", "", "");
        return false;
    }

    if (! peekTokenClass(EHTokComma))
        return true;

    return true;
}